

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal_usage<char_const*&,unsigned_int,std::__cxx11::string&,unsigned_int,unsigned_int,unsigned_int&,unsigned_int&>
          (Reporter *this,char **args,uint *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,uint *args_3,
          uint *args_4,uint *args_5,uint *args_6)

{
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<std::__cxx11::basic_string<char>_&> fmt_00;
  format_string<unsigned_int,_std::__cxx11::basic_string<char>_&,_unsigned_int,_unsigned_int,_unsigned_int_&,_unsigned_int_&>
  fmt_01;
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  uint *in_RDX;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint *in_R8;
  undefined8 in_R9;
  FatalError *in_stack_00000008;
  ReturnCode returnCode;
  ostream *in_stack_ffffffffffffff00;
  ostream *poVar2;
  char *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  char *local_e0 [2];
  uint *local_d0;
  size_t local_c8;
  char *local_c0;
  size_t local_b8;
  ReturnCode RStack_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  uint *args_3_00;
  uint **args_4_00;
  
  RStack_ac = (ReturnCode)((ulong)in_R9 >> 0x20);
  pcVar4 = "{} fatal: ";
  local_c0 = "{} fatal: ";
  pbVar3 = in_RDI;
  local_b8 = std::char_traits<char>::length((char_type *)0x2393e6);
  fmt.str_.size_ = in_stack_ffffffffffffff10;
  fmt.str_.data_ = in_stack_ffffffffffffff08;
  ::fmt::v10::print<std::__cxx11::string&>(in_stack_ffffffffffffff00,fmt,in_RDI);
  args_4_00 = &local_d0;
  args_3_00 = *(uint **)in_RSI;
  poVar2 = in_RSI;
  local_d0 = args_3_00;
  local_c8 = std::char_traits<char>::length((char_type *)0x23948a);
  fmt_01.str_.size_ = (size_t)pcVar4;
  fmt_01.str_.data_ = (char *)pbVar3;
  returnCode = RStack_ac;
  ::fmt::v10::
  print<unsigned_int,std::__cxx11::string&,unsigned_int,unsigned_int,unsigned_int&,unsigned_int&>
            (poVar2,fmt_01,in_RDX,in_RCX,in_R8,args_3_00,(uint *)args_4_00,(uint *)in_RSI);
  poVar2 = (ostream *)local_e0;
  local_e0[0] = " See \'{} --help\'.\n";
  pcVar4 = (char *)std::char_traits<char>::length((char_type *)0x239559);
  *(char **)(poVar2 + 8) = pcVar4;
  fmt_00.str_.size_ = in_stack_ffffffffffffff10;
  fmt_00.str_.data_ = in_stack_ffffffffffffff08;
  ::fmt::v10::print<std::__cxx11::string&>(poVar2,fmt_00,in_RDI);
  uVar1 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(in_stack_00000008,returnCode);
  __cxa_throw(uVar1,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }